

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::toString_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this,TypeCategory category)

{
  char *pcVar1;
  char *pcVar2;
  
  switch(category) {
  case Bitmask:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "bitmask";
    pcVar1 = "";
    break;
  case BaseType:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "basetype";
    pcVar1 = "";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x41f1,"std::string VulkanHppGenerator::toString(TypeCategory)");
  case Define:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "define";
    pcVar1 = "";
    break;
  case Enum:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "enum";
    pcVar1 = "";
    break;
  case ExternalType:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "ExternalType";
    pcVar1 = "";
    break;
  case FuncPointer:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "funcpointer";
    pcVar1 = "";
    break;
  case Handle:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "handle";
    pcVar1 = "";
    break;
  case Struct:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "struct";
    pcVar1 = "";
    break;
  case Union:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "union";
    pcVar1 = "";
    break;
  case Unknown:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "unkown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::toString( TypeCategory category )
{
  switch ( category )
  {
    case TypeCategory::Bitmask     : return "bitmask";
    case TypeCategory::BaseType    : return "basetype";
    case TypeCategory::Define      : return "define";
    case TypeCategory::Enum        : return "enum";
    case TypeCategory::ExternalType: return "ExternalType";
    case TypeCategory::FuncPointer : return "funcpointer";
    case TypeCategory::Handle      : return "handle";
    case TypeCategory::Struct      : return "struct";
    case TypeCategory::Union       : return "union";
    case TypeCategory::Unknown     : return "unkown";
    default                        : assert( false ); return "";
  }
}